

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgaussrule.cpp
# Opt level: O3

void __thiscall
TPZGaussRule::ComputingGaussJacobiQuadrature
          (TPZGaussRule *this,int *npoints,longdouble alpha,longdouble beta,
          TPZVec<long_double> *Location,TPZVec<long_double> *Weight)

{
  uint uVar1;
  double dVar2;
  ulong uVar3;
  longdouble *plVar4;
  longdouble *plVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  bool bVar12;
  longdouble in_ST0;
  longdouble lVar13;
  longdouble lVar14;
  longdouble lVar15;
  longdouble lVar16;
  longdouble lVar17;
  longdouble lVar18;
  longdouble lVar19;
  longdouble in_ST1;
  longdouble lVar20;
  longdouble lVar21;
  longdouble in_ST2;
  longdouble lVar22;
  longdouble in_ST3;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  TPZVec<long_double> c;
  TPZVec<long_double> b;
  longdouble local_128;
  long local_118;
  undefined2 uStack_110;
  uint local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  longdouble *local_f0;
  undefined2 uStack_e8;
  longdouble local_e0;
  longdouble local_d4;
  longdouble local_c8;
  longdouble local_bc;
  longdouble local_b0;
  longdouble local_a4;
  TPZVec<long_double> *local_98;
  TPZVec<long_double> local_90;
  TPZVec<long_double> local_70;
  ulong local_50;
  longdouble local_48;
  longdouble local_3c;
  
  local_70._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813e70;
  local_70.fStore = (longdouble *)0x0;
  local_70.fNElements = 0;
  local_70.fNAlloc = 0;
  local_90._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813e70;
  local_90.fStore = (longdouble *)0x0;
  local_90.fNElements = 0;
  local_90.fNAlloc = 0;
  local_128 = (longdouble)0;
  local_98 = Location;
  (*Location->_vptr_TPZVec[2])(Location,(long)*npoints,&local_128);
  local_128 = (longdouble)0;
  (*Weight->_vptr_TPZVec[2])(Weight,(long)*npoints,&local_128);
  local_128 = (longdouble)0;
  TPZVec<long_double>::Resize(&local_70,(long)*npoints,&local_128);
  local_128 = (longdouble)0;
  TPZVec<long_double>::Resize(&local_90,(long)*npoints,&local_128);
  lVar13 = -(longdouble)1;
  if (alpha <= lVar13) {
    std::operator<<((ostream *)&std::cerr,
                    "\nJACOBI_COMPUTE - Fatal error!\n  -1.0 < ALPHA is required.\n");
  }
  else {
    if (lVar13 < beta) {
      uVar1 = *npoints;
      lVar14 = alpha + beta;
      if (0 < (int)uVar1) {
        iVar8 = 1;
        lVar9 = 0;
        in_ST3 = in_ST2;
        do {
          lVar15 = (longdouble)0;
          if (beta - alpha != (longdouble)0 && lVar14 != (longdouble)0) {
            lVar15 = (longdouble)iVar8 + (longdouble)iVar8;
            lVar15 = ((beta - alpha) * lVar14) /
                     ((lVar14 + lVar15 + (longdouble)-2.0) * (lVar15 + lVar14));
            in_ST2 = in_ST1;
            in_ST3 = in_ST1;
            local_f4 = iVar8;
          }
          *(longdouble *)((long)local_70.fStore + lVar9) = lVar15;
          if (lVar9 == 0) {
            *local_90.fStore = (longdouble)0;
          }
          else {
            local_f8 = iVar8 + -1;
            lVar15 = (longdouble)local_f8;
            lVar16 = (longdouble)iVar8 + (longdouble)iVar8;
            lVar17 = lVar16 + (longdouble)-2.0 + lVar14;
            *(longdouble *)((long)local_90.fStore + lVar9) =
                 ((lVar15 + lVar14) * (lVar15 + beta) * (alpha + lVar15) * lVar15 * (longdouble)4.0)
                 / (lVar17 * lVar17 * (lVar16 + lVar13 + lVar14) *
                   (lVar16 + (longdouble)-3.0 + lVar14));
            in_ST1 = in_ST0;
            in_ST2 = in_ST0;
            in_ST3 = in_ST0;
            local_fc = iVar8;
          }
          lVar9 = lVar9 + 0x10;
          iVar8 = iVar8 + 1;
        } while ((ulong)uVar1 << 4 != lVar9);
      }
      local_a4 = (longdouble)1 + alpha;
      dVar2 = gamma((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      dVar2 = gamma(dVar2);
      local_e0 = lVar14 + (longdouble)2.0;
      dVar2 = gamma(dVar2);
      lVar13 = (longdouble)1;
      if (1 < *npoints) {
        lVar13 = (longdouble)1;
        lVar9 = 0;
        do {
          lVar13 = *(longdouble *)((long)local_90.fStore + lVar9 + 0x10) * lVar13;
          lVar9 = lVar9 + 0x10;
        } while ((ulong)(uint)*npoints * 0x10 + -0x10 != lVar9);
      }
      exp2l(SUB84(dVar2,0));
      uVar1 = *npoints;
      uVar3 = (ulong)uVar1;
      if (0 < (int)uVar1) {
        local_48 = (longdouble)(int)uVar1;
        local_100 = uVar1 - 8;
        local_108 = uVar1 * uVar1;
        lVar15 = (longdouble)local_108;
        lVar14 = (longdouble)1;
        local_3c = (_DAT_014d7880 * (longdouble)local_100) / local_48 + lVar14;
        local_b0 = (-(_DAT_014d7860 + _DAT_014d7850 * alpha) / (_DAT_014d7870 * alpha + lVar14)) *
                   local_3c *
                   (((longdouble)8.0 * beta) / (lVar15 * (_DAT_014d7890 + beta)) + lVar14);
        local_bc = (((ABS(alpha) * (longdouble)0.25 + lVar14) * _DAT_014d78e0 * beta) / local_48 +
                   lVar14) * (((_DAT_014d78d0 * alpha + lVar14) *
                              _DAT_014d78c0 * (longdouble)local_100) / local_48 + lVar14) *
                             (-(_DAT_014d78a0 + alpha) /
                             ((_DAT_014d78b0 * alpha + lVar14) * local_a4));
        plVar4 = local_98->fStore;
        local_50 = (ulong)(local_108 + 4);
        lVar16 = alpha / local_48;
        lVar17 = _DAT_014d7940 * lVar16 * (beta / local_48) +
                 _DAT_014d7930 * lVar16 * lVar16 +
                 _DAT_014d7920 * (beta / local_48) + (longdouble)1 + _DAT_014d7910 * lVar16;
        lVar14 = (longdouble)1;
        local_a4 = (lVar17 - local_a4 *
                             ((_DAT_014d7900 * lVar16) / local_48 +
                             _DAT_014d78f0 / (longdouble)local_50)) / lVar17;
        local_d4 = (lVar14 / (((longdouble)8.0 * alpha) / (lVar15 * (_DAT_014d7890 + alpha)) +
                             lVar14)) *
                   (lVar14 / local_3c) *
                   ((_DAT_014d7870 * beta + lVar14) / (_DAT_014d7860 + _DAT_014d7850 * beta));
        local_104 = uVar1 - 4;
        local_c8 = (lVar14 / ((alpha * (longdouble)20.0) / (lVar15 * (alpha + (longdouble)7.5)) +
                             lVar14)) *
                   (lVar14 / ((_DAT_014d7980 * (longdouble)local_104) /
                              (_DAT_014d7990 * (longdouble)local_104 + lVar14) + lVar14)) *
                   ((_DAT_014d7950 * beta + lVar14) / (_DAT_014d7970 + _DAT_014d7960 * beta));
        lVar15 = (alpha - beta) / local_e0;
        uVar7 = (ulong)(uVar1 - 1);
        local_e0 = (longdouble)CONCAT28(local_e0._8_2_,Weight);
        plVar5 = Weight->fStore;
        _local_118 = CONCAT28((short)((unkuint10)_DAT_014d7870 >> 0x40),uVar3 * 0x10);
        _local_f0 = CONCAT28((short)((unkuint10)_DAT_014d7860 >> 0x40),plVar4 + (uVar3 - 3));
        uVar6 = 1;
        lVar14 = (longdouble)0;
        do {
          lVar20 = (longdouble)1;
          iVar8 = (int)uVar6;
          lVar16 = lVar20;
          lVar17 = local_a4;
          if (iVar8 != 1) {
            if (iVar8 == 3) {
              lVar18 = *plVar4 - lVar14;
              lVar17 = local_b0;
LAB_00b4f186:
              lVar17 = lVar17 * lVar18;
            }
            else {
              if (iVar8 == 2) {
                lVar18 = lVar20 - lVar14;
                lVar17 = local_bc;
                goto LAB_00b4f186;
              }
              if (uVar7 <= uVar6) {
                if (uVar6 == uVar7) {
                  lVar18 = lVar14 - plVar4[uVar7 - 3];
                  lVar17 = local_c8;
                }
                else {
                  lVar17 = lVar14;
                  if (uVar6 != uVar3) goto LAB_00b4f192;
                  lVar18 = lVar14 - plVar4[uVar3 - 3];
                  lVar17 = local_d4;
                }
                goto LAB_00b4f186;
              }
              lVar14 = plVar4[uVar6 - 2] * (longdouble)3.0 + plVar4[uVar6 - 3] * (longdouble)-3.0;
              lVar17 = plVar4[uVar6 - 4];
            }
            lVar17 = lVar17 + lVar14;
          }
LAB_00b4f192:
          do {
            lVar14 = lVar17;
            lVar16 = lVar16 * (longdouble)0.5;
            lVar17 = lVar14;
          } while (lVar20 < lVar16 + lVar20);
          uVar10 = 1;
          do {
            lVar18 = (longdouble)1;
            lVar17 = lVar15 + lVar14;
            lVar20 = lVar18;
            if (uVar1 != 1) {
              lVar11 = 0x10;
              lVar9 = uVar3 - 1;
              lVar19 = (longdouble)0;
              lVar21 = lVar18;
              lVar22 = lVar18;
              do {
                lVar20 = lVar17;
                lVar18 = lVar14 - *(longdouble *)((long)local_70.fStore + lVar11);
                lVar17 = lVar18 * lVar20 - lVar21 * *(longdouble *)((long)local_90.fStore + lVar11);
                lVar18 = (lVar18 * lVar22 + lVar20) -
                         *(longdouble *)((long)local_90.fStore + lVar11) * lVar19;
                lVar11 = lVar11 + 0x10;
                lVar9 = lVar9 + -1;
                lVar19 = lVar22;
                lVar21 = lVar20;
                lVar22 = lVar18;
              } while (lVar9 != 0);
            }
            lVar14 = lVar14 - lVar17 / lVar18;
          } while (((lVar16 + lVar16) * (ABS(lVar14) + (longdouble)1) < ABS(lVar17 / lVar18)) &&
                  (bVar12 = uVar10 < 10, uVar10 = uVar10 + 1, bVar12));
          plVar4[uVar6 - 1] = lVar14;
          plVar5[uVar6 - 1] = (lVar13 * ((in_ST1 * in_ST0) / in_ST2) * in_ST3) / (lVar18 * lVar20);
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar3 + 1);
        local_10c = uVar1;
        if (uVar3 != 1) {
          plVar4 = local_98->fStore;
          plVar5 = plVar4 + uVar3;
          uVar6 = (ulong)(uVar1 >> 1);
          do {
            plVar5 = plVar5 + -1;
            lVar13 = *plVar4;
            *plVar4 = *plVar5;
            *plVar5 = lVar13;
            plVar4 = plVar4 + 1;
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
          if (uVar1 != 1) {
            plVar4 = Weight->fStore;
            plVar5 = plVar4 + uVar3;
            uVar3 = (ulong)(uVar1 >> 1);
            do {
              plVar5 = plVar5 + -1;
              lVar13 = *plVar4;
              *plVar4 = *plVar5;
              *plVar5 = lVar13;
              plVar4 = plVar4 + 1;
              uVar3 = uVar3 - 1;
            } while (uVar3 != 0);
          }
        }
      }
      local_90._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813e70;
      if (local_90.fStore != (longdouble *)0x0) {
        operator_delete__(local_90.fStore);
      }
      local_70._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813e70;
      if (local_70.fStore != (longdouble *)0x0) {
        operator_delete__(local_70.fStore);
      }
      return;
    }
    std::operator<<((ostream *)&std::cerr,
                    "\nJACOBI_COMPUTE - Fatal error!\n  -1.0 < BETA is required.\n");
  }
  exit(1);
}

Assistant:

void TPZGaussRule::ComputingGaussJacobiQuadrature(int *npoints,long double alpha, long double beta,TPZVec<long double> &Location,TPZVec<long double> &Weight) {
	// Computing number of points appropriated to the wished order = 2*npoints - 1. Note: If odd we need increment one point more
	long double an, bn;
	TPZVec<long double> b;
	TPZVec<long double> c;
	long double cc, delta, dp2;
	int i;
	long double p1, prod, r1, r2, r3, temp, x0 = 0.0;
	
	Location.Resize((*npoints),0.0L);
	Weight.Resize((*npoints),0.0L);
	
	b.Resize((*npoints),0.0L);
	c.Resize((*npoints),0.0L);
	
	//  This method permit only alpha > -1.0 and beta > -1.0
	if(alpha <= -1.0L) {
		std::cerr << "\nJACOBI_COMPUTE - Fatal error!\n  -1.0 < ALPHA is required.\n";
		std::exit ( 1 );
	}
	if(beta <= -1.0L) {
		std::cerr << "\nJACOBI_COMPUTE - Fatal error!\n  -1.0 < BETA is required.\n";
		std::exit ( 1 );
	}
	
	//  Set the recursion coefficients.
	for(i=1;i<=(*npoints);i++) {
		if(alpha + beta == 0.0L || beta - alpha == 0.0L) {
			b[i-1] = 0.0L;
		}
		else {
			b[i-1] = ( alpha + beta ) * ( beta - alpha ) / 
			( ( alpha + beta + ( 2.0L * ((long double)(i)) ) ) 
             * ( alpha + beta + ( 2.0L * ((long double)(i)) - 2.0L ) ) );
		}
		if(i==1) {
			c[i-1] = 0.0L;
		}
		else {
			c[i-1] = 4.0L * ( ((long double)(i)) - 1.0L ) * ( alpha + ( ((long double)(i)) - 1.0L ) ) * ( beta + ( ((long double)(i)) - 1.0L ) ) 
            * ( alpha + beta + ( ((long double)(i)) - 1.0L ) ) / 
            ( ( alpha + beta + ( 2.0L * ((long double)(i)) - 1.0L ) ) * (std::pow(alpha + beta + (2.0L*((long double)(i)) - 2.0L),2.0L)) 
			 * ( alpha + beta + ( 2.0L * ((long double)(i)) - 3.0L ) ) );
		}
	}
	
	delta = (gamma(alpha + 1.0L) * gamma(beta + 1.0L)) / gamma(alpha + beta + 2.0L);
	
	prod = 1.0L;
	for(i=2;i <= (*npoints);i++)
		prod = prod * c[i-1];
	cc = delta * std::pow( 2.0L, alpha + beta + 1.0L ) * prod;
	
	for(i=1;i<=(*npoints);i++) {
		if(i==1) {
			an = alpha / (long double)((*npoints));
			bn = beta / (long double)((*npoints));
			
			r1 = ( 1.0L + alpha ) * ( 2.78L / ( 4.0L + (long double)((*npoints)*(*npoints))) + 0.768L * an / (long double)((*npoints)));
			r2 = 1.0L + 1.48L * an + 0.96L * bn + 0.452L * an * an + 0.83L * an * bn;
			
			x0 = ( r2 - r1 ) / r2;
		}
		else if(i==2) {
			r1 = ( 4.1L + alpha ) / ( ( 1.0L + alpha ) * ( 1.0L + 0.156L * alpha ) );
			
			r2 = 1.0L + 0.06L * ((long double)((*npoints)) - 8.0L) * (1.0L + 0.12L * alpha) / (long double)((*npoints));
			r3 = 1.0L + 0.012L * beta * (1.0L + 0.25L * fabsl(alpha)) / (long double)((*npoints));
			
			x0 = x0 - r1*r2*r3*(1.0L - x0);
		}
		else if(i==3) {
			r1 = ( 1.67L + 0.28L * alpha ) / ( 1.0L + 0.37L * alpha );
			r2 = 1.0L + 0.22L * ( (long double)((*npoints)) - 8.0L) / (long double)((*npoints));
			r3 = 1.0L + 8.0L * beta / ( ( 6.28L + beta ) * (long double)((*npoints)*(*npoints)));
			
			x0 = x0 - r1 * r2 * r3 * ( Location[0] - x0 );
		}
		else if(i<(*npoints)-1) {
			x0 = 3.0L * Location[i-2] - 3.0L * Location[i-3] + Location[i-4];
		}
		else if(i==(*npoints)-1) {
			r1 = ( 1.0L + 0.235L * beta ) / (0.766L + 0.119L * beta);
			r2 = 1.0L / ( 1.0L + 0.639L * ((long double)((*npoints)) - 4.0L) 
						 / ( 1.0L + 0.71L * ((long double)((*npoints)) - 4.0L)));
			
			r3 = 1.0L / ( 1.0L + 20.0L * alpha / ( ( 7.5L + alpha ) * 
												  (long double)((*npoints)*(*npoints))));
			
			x0 = x0 + r1 * r2 * r3 * ( x0 - Location[i-3] );
		}
		else if(i==(*npoints)) {
			r1 = ( 1.0L + 0.37L * beta ) / ( 1.67L + 0.28L * beta );
			
			r2 = 1.0L / ( 1.0L + 0.22L * ( (long double)((*npoints)) - 8.0L ) 
						 / (long double)((*npoints)));
			
			r3 = 1.0L / ( 1.0L + 8.0L * alpha / 
						 ( ( 6.28L + alpha ) * (long double)((*npoints)*(*npoints))));
			
			x0 = x0 + r1 * r2 * r3 * ( x0 - Location[i-3] );
		}
		
		// Improving the root of the Jacobi polinomial
		long double d;
		long double precision;
		int itera, itera_max = 10;

		precision = machinePrecision();

		for(itera=1;itera<=itera_max;itera++) {
			d = JacobiPolinomial(x0,(*npoints),alpha,beta,b,c,&dp2,&p1);
			d /= dp2;
			x0 = x0 - d;
			if(fabsl(d) <= precision*(fabsl(x0) + 1.0L)) {
				break;
			}
		}
		Location[i-1] = x0;
		Weight[i-1] = cc/(dp2*p1);
	}

	// inverting the position of the points
	for(i=1;i<=(*npoints)/2;i++) {
		temp = Location[i-1];
		Location[i-1] = Location[(*npoints)-i];
		Location[(*npoints)-i] = temp;
	}
	// inverting the position of the weights
	for(i=1;i<=(*npoints)/2;i++) {
		temp = Weight[i-1];
		Weight[i-1] = Weight[(*npoints)-i];
		Weight[(*npoints)-i] = temp;
	}
}